

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O1

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::ParquetReader::ReadStatistics(ParquetReader *this,string *name)

{
  size_t __n;
  _Head_base<0UL,_const_duckdb_parquet::FileMetaData_*,_false> _Var1;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> _Var2;
  __uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> _Var3;
  int iVar4;
  reference pvVar5;
  ParquetFileMetadataCache *pPVar6;
  pointer pPVar7;
  pointer this_00;
  type other;
  undefined8 *in_RDX;
  vector<duckdb_parquet::ColumnChunk,_true> *columns;
  pointer __p;
  size_type __n_00;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> _Var8;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> column_stats
  ;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> chunk_stats;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> local_50;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> local_48;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> local_40;
  ParquetReader *local_38;
  
  local_40._M_head_impl = (BaseStatistics *)this;
  if ((pointer)name[2]._M_string_length == name[2]._M_dataplus._M_p) {
    __n_00 = 0;
  }
  else {
    __n_00 = 0;
    do {
      pvVar5 = vector<duckdb::MultiFileColumnDefinition,_true>::operator[]
                         ((vector<duckdb::MultiFileColumnDefinition,_true> *)(name + 2),__n_00);
      __n = (pvVar5->name)._M_string_length;
      if ((__n == in_RDX[1]) &&
         ((__n == 0 ||
          (iVar4 = bcmp((pvVar5->name)._M_dataplus._M_p,(void *)*in_RDX,__n), iVar4 == 0)))) break;
      __n_00 = __n_00 + 1;
    } while (__n_00 < (ulong)(((long)(name[2]._M_string_length - (long)name[2]._M_dataplus._M_p) >>
                              3) * -0x79435e50d79435e5));
  }
  if (__n_00 == ((long)(name[2]._M_string_length - (long)name[2]._M_dataplus._M_p) >> 3) *
                -0x79435e50d79435e5) {
    ((local_40._M_head_impl)->type).id_ = INVALID;
    ((local_40._M_head_impl)->type).physical_type_ = ~INVALID;
    *(undefined6 *)&((local_40._M_head_impl)->type).field_0x2 = 0;
    _Var8._M_head_impl = local_40._M_head_impl;
  }
  else {
    local_50._M_head_impl = (BaseStatistics *)0x0;
    pPVar6 = shared_ptr<duckdb::ParquetFileMetadataCache,_true>::operator->
                       ((shared_ptr<duckdb::ParquetFileMetadataCache,_true> *)(name + 9));
    _Var1._M_head_impl =
         (pPVar6->metadata).
         super_unique_ptr<const_duckdb_parquet::FileMetaData,_std::default_delete<const_duckdb_parquet::FileMetaData>_>
         ._M_t.
         super___uniq_ptr_impl<const_duckdb_parquet::FileMetaData,_std::default_delete<const_duckdb_parquet::FileMetaData>_>
         ._M_t.
         super__Tuple_impl<0UL,_const_duckdb_parquet::FileMetaData_*,_std::default_delete<const_duckdb_parquet::FileMetaData>_>
         .super__Head_base<0UL,_const_duckdb_parquet::FileMetaData_*,_false>._M_head_impl;
    pPVar7 = unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>,_true>
             ::operator->((unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>,_true>
                           *)&name[0xb].field_2._M_allocated_capacity);
    local_38 = (ParquetReader *)
               vector<duckdb::ParquetColumnSchema,_true>::operator[](&pPVar7->children,__n_00);
    if (*(pointer *)((long)&(_Var1._M_head_impl)->row_groups + 8) !=
        *(pointer *)
         &((_Var1._M_head_impl)->row_groups).
          super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>) {
      columns = (vector<duckdb_parquet::ColumnChunk,_true> *)0x0;
      do {
        vector<duckdb_parquet::RowGroup,_true>::operator[]
                  (&(_Var1._M_head_impl)->row_groups,(size_type)columns);
        ParquetColumnSchema::Stats
                  ((ParquetColumnSchema *)&stack0xffffffffffffffb8,local_38,(idx_t)name,columns);
        _Var2._M_head_impl = local_48._M_head_impl;
        if ((_Head_base<0UL,_duckdb::BaseStatistics_*,_false>)local_48._M_head_impl ==
            (_Head_base<0UL,_duckdb::BaseStatistics_*,_false>)0x0) {
          *(char *)((long)local_40._M_head_impl + 0) = '\0';
          *(char *)((long)local_40._M_head_impl + 1) = '\0';
          *(char *)((long)local_40._M_head_impl + 2) = '\0';
          *(char *)((long)local_40._M_head_impl + 3) = '\0';
          *(char *)((long)local_40._M_head_impl + 4) = '\0';
          *(char *)((long)local_40._M_head_impl + 5) = '\0';
          *(char *)((long)local_40._M_head_impl + 6) = '\0';
          *(char *)((long)local_40._M_head_impl + 7) = '\0';
        }
        else if (local_50._M_head_impl == (BaseStatistics *)0x0) {
          local_48._M_head_impl = (BaseStatistics *)0x0;
          local_50._M_head_impl = _Var2._M_head_impl;
        }
        else {
          this_00 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                    ::operator->((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                                  *)&local_50);
          other = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                  ::operator*((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                               *)&stack0xffffffffffffffb8);
          BaseStatistics::Merge(this_00,other);
        }
        _Var3._M_t.
        super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
        .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl =
             (tuple<duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>)
             (tuple<duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>)
             local_48._M_head_impl;
        if ((_Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
             )local_48._M_head_impl != (BaseStatistics *)0x0) {
          BaseStatistics::~BaseStatistics(local_48._M_head_impl);
          operator_delete((void *)_Var3._M_t.
                                  super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
                                  .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>.
                                  _M_head_impl);
        }
        if (_Var2._M_head_impl == (BaseStatistics *)0x0) goto LAB_01b86043;
        columns = (vector<duckdb_parquet::ColumnChunk,_true> *)
                  ((long)&(columns->
                          super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                          ).
                          super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                          ._M_impl.super__Vector_impl_data._M_start + 1);
      } while (columns < (vector<duckdb_parquet::ColumnChunk,_true> *)
                         (((long)*(pointer *)((long)&(_Var1._M_head_impl)->row_groups + 8) -
                           *(long *)&((_Var1._M_head_impl)->row_groups).
                                     super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>
                          >> 5) * -0x5555555555555555));
    }
    *(BaseStatistics **)&(local_40._M_head_impl)->type = local_50._M_head_impl;
    local_50._M_head_impl = (BaseStatistics *)0x0;
LAB_01b86043:
    _Var8._M_head_impl = local_40._M_head_impl;
    _Var2._M_head_impl = local_50._M_head_impl;
    if (local_50._M_head_impl != (BaseStatistics *)0x0) {
      BaseStatistics::~BaseStatistics(local_50._M_head_impl);
      operator_delete(_Var2._M_head_impl);
    }
  }
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         _Var8._M_head_impl;
}

Assistant:

unique_ptr<BaseStatistics> ParquetReader::ReadStatistics(const string &name) {
	idx_t file_col_idx;
	for (file_col_idx = 0; file_col_idx < columns.size(); file_col_idx++) {
		if (columns[file_col_idx].name == name) {
			break;
		}
	}
	if (file_col_idx == columns.size()) {
		return nullptr;
	}

	unique_ptr<BaseStatistics> column_stats;
	auto file_meta_data = GetFileMetadata();
	auto &column_schema = root_schema->children[file_col_idx];

	for (idx_t row_group_idx = 0; row_group_idx < file_meta_data->row_groups.size(); row_group_idx++) {
		auto &row_group = file_meta_data->row_groups[row_group_idx];
		auto chunk_stats = column_schema.Stats(*this, row_group_idx, row_group.columns);
		if (!chunk_stats) {
			return nullptr;
		}
		if (!column_stats) {
			column_stats = std::move(chunk_stats);
		} else {
			column_stats->Merge(*chunk_stats);
		}
	}
	return column_stats;
}